

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRSDA::CalcAngle(ChLinkRSDA *this)

{
  ChBodyFrame *pCVar1;
  ChBodyFrame *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  dVar13 = (this->m_csys1).rot.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar13;
  pCVar1 = (this->super_ChLink).Body1;
  pCVar2 = (this->super_ChLink).Body2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar57 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar57;
  dVar60 = (this->m_csys1).rot.m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar60;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar60 * dVar57;
  auVar11 = vfmsub231sd_fma(auVar58,auVar20,auVar14);
  dVar60 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar60;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (this->m_csys1).rot.m_data[2];
  auVar11 = vfnmadd231sd_fma(auVar11,auVar38,auVar40);
  dVar61 = (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar61;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (this->m_csys1).rot.m_data[3];
  auVar14 = vfnmadd231sd_fma(auVar11,auVar43,auVar47);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar13 * dVar57;
  auVar11 = vfmadd231sd_fma(auVar50,auVar20,auVar32);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar43,auVar40);
  auVar7 = vfmadd231sd_fma(auVar11,auVar38,auVar47);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar13 * dVar60;
  auVar11 = vfmadd231sd_fma(auVar51,auVar20,auVar40);
  auVar11 = vfmadd231sd_fma(auVar11,auVar43,auVar32);
  auVar12 = vfnmadd231sd_fma(auVar11,auVar27,auVar47);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar13 * dVar61;
  auVar11 = vfmadd231sd_fma(auVar15,auVar20,auVar47);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar38,auVar32);
  auVar8 = vfmadd231sd_fma(auVar11,auVar27,auVar40);
  dVar13 = (this->m_csys2).rot.m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar13;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar57 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar57;
  dVar60 = (this->m_csys2).rot.m_data[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar60;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar60 * dVar57;
  auVar11 = vfmsub231sd_fma(auVar16,auVar28,auVar21);
  dVar60 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar60;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (this->m_csys2).rot.m_data[2];
  auVar11 = vfnmadd231sd_fma(auVar11,auVar41,auVar44);
  dVar61 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar61;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (this->m_csys2).rot.m_data[3];
  auVar18 = vfnmadd231sd_fma(auVar11,auVar48,auVar52);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar13 * dVar57;
  auVar11 = vfmadd231sd_fma(auVar55,auVar28,auVar39);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar48,auVar44);
  auVar9 = vfmadd231sd_fma(auVar11,auVar41,auVar52);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar13 * dVar60;
  auVar11 = vfmadd231sd_fma(auVar56,auVar28,auVar44);
  auVar11 = vfmadd231sd_fma(auVar11,auVar48,auVar39);
  auVar19 = vfnmadd231sd_fma(auVar11,auVar33,auVar52);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar13 * dVar61;
  auVar11 = vfmadd231sd_fma(auVar22,auVar28,auVar52);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar41,auVar39);
  auVar10 = vfmadd231sd_fma(auVar11,auVar33,auVar44);
  dVar60 = auVar7._0_8_;
  dVar57 = auVar14._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar60 * dVar60;
  auVar11 = vfmadd231sd_fma(auVar29,auVar14,auVar14);
  auVar17 = ZEXT816(0xbff0000000000000);
  auVar20 = ZEXT816(0x4000000000000000);
  auVar11 = vfmadd213sd_fma(auVar11,auVar20,auVar17);
  dVar62 = auVar8._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar57 * dVar62;
  auVar6 = vfmadd213sd_fma(auVar12,auVar7,auVar34);
  dVar61 = auVar12._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar57 * dVar61;
  auVar15 = vfmsub213sd_fma(auVar8,auVar7,auVar45);
  auVar16 = vfmsub231sd_fma(auVar34,auVar7,auVar12);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar61 * dVar61;
  auVar7 = vfmadd231sd_fma(auVar46,auVar14,auVar14);
  auVar7 = vfmadd213sd_fma(auVar7,auVar20,auVar17);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar60 * dVar57;
  auVar12 = vfmadd213sd_avx512f(auVar8,auVar12,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar9._0_8_ * auVar9._0_8_;
  auVar8 = vfmadd231sd_fma(auVar54,auVar18,auVar18);
  auVar8 = vfmadd213sd_fma(auVar8,auVar20,auVar17);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar18._0_8_ * auVar10._0_8_;
  auVar14 = vfmadd231sd_fma(auVar59,auVar9,auVar19);
  dVar13 = auVar14._0_8_ + auVar14._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar19._0_8_ * auVar18._0_8_;
  auVar9 = vfmsub231sd_fma(auVar17,auVar9,auVar10);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar13 * auVar7._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar16._0_8_ + auVar16._0_8_;
  auVar7 = vfmadd231sd_fma(auVar18,auVar8,auVar35);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar9._0_8_ + auVar9._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar12._0_8_ + auVar12._0_8_;
  auVar7 = vfmadd231sd_fma(auVar7,auVar23,auVar49);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar13 * (auVar6._0_8_ + auVar6._0_8_);
  auVar11 = vfmadd231sd_fma(auVar36,auVar11,auVar8);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar15._0_8_ + auVar15._0_8_;
  auVar8 = vfmadd231sd_fma(auVar11,auVar23,auVar42);
  dVar13 = asin(auVar7._0_8_);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar7._0_8_;
  uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar11,2);
  bVar5 = (bool)((byte)uVar3 & 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar8._0_8_;
  uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar6,6);
  bVar4 = (bool)((byte)uVar3 & 1);
  this->m_angle =
       (double)((ulong)bVar4 *
                (long)((double)((ulong)bVar5 * 0x400921fb54442d18 +
                               (ulong)!bVar5 * -0x3ff6de04abbbd2e8) - dVar13) +
               (ulong)!bVar4 * (long)dVar13);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar62;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar57;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar62 * dVar62;
  auVar11 = vfmadd231sd_fma(auVar12,auVar24,auVar24);
  auVar11 = vfmadd132sd_fma(auVar11,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar61;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar60 * dVar57;
  auVar7 = vfmsub213sd_fma(auVar25,auVar30,auVar7);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar60;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar57 * dVar61;
  auVar6 = vfmadd213sd_fma(auVar30,auVar37,auVar8);
  (this->m_axis).m_data[0] = auVar6._0_8_ + auVar6._0_8_;
  (this->m_axis).m_data[1] = auVar7._0_8_ + auVar7._0_8_;
  (this->m_axis).m_data[2] = auVar11._0_8_;
  ChFrameMoving<double>::GetWvel_par(&((this->super_ChLink).Body2)->super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_par(&((this->super_ChLink).Body1)->super_ChFrameMoving<double>);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->m_axis).m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_30 - local_48;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (local_28 - local_40) * (this->m_axis).m_data[1];
  auVar11 = vfmadd231sd_fma(auVar26,auVar19,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->m_axis).m_data[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_20 - local_38;
  auVar11 = vfmadd231sd_fma(auVar11,auVar31,auVar10);
  this->m_angle_dt = auVar11._0_8_;
  return;
}

Assistant:

void ChLinkRSDA::CalcAngle() {
    // Express the RSDA frames in absolute frame
    ChQuaternion<> rot1 = Body1->GetRot() * m_csys1.rot;
    ChQuaternion<> rot2 = Body2->GetRot() * m_csys2.rot;

    // Extract unit vectors
    auto f1 = rot1.GetXaxis();
    auto g1 = rot1.GetYaxis();
    auto f2 = rot2.GetXaxis();

    // Calculate sine and cosine of rotation angle
    double s = Vdot(g1, f2);
    double c = Vdot(f1, f2);

    // Get angle (in [-pi , +pi])
    double a = std::asin(s);
    if (c >= 0) {
        m_angle = a;
    } else {
        m_angle = (s >= 0) ? CH_C_PI - a : -CH_C_PI - a;
    }

    // Get angle rate of change
    m_axis = rot1.GetZaxis();
    m_angle_dt = Vdot(m_axis, Body2->GetWvel_par() - Body1->GetWvel_par());
}